

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_object_detail.hpp
# Opt level: O1

bool __thiscall
chaiscript::dispatch::detail::Dynamic_Object_Function::dynamic_object_typename_match
          (Dynamic_Object_Function *this,Boxed_Value *bv,string *name,
          unique_ptr<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_> *ti,
          Type_Conversions_State *t_conversions)

{
  size_t __n;
  Type_Info *ti_00;
  bool bVar1;
  int iVar2;
  Dynamic_Object *pDVar3;
  
  bVar1 = Type_Info::bare_equal
                    (&((bv->m_data).
                       super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr)->m_type_info,&this->m_doti);
  if (bVar1) {
    pDVar3 = boxed_cast<chaiscript::dispatch::Dynamic_Object_const&>(bv,t_conversions);
    iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                      (name,"Dynamic_Object");
    if (iVar2 == 0) {
      return true;
    }
    __n = (pDVar3->m_type_name)._M_string_length;
    if (__n == name->_M_string_length) {
      if (__n == 0) {
        return true;
      }
      iVar2 = bcmp((pDVar3->m_type_name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
      return iVar2 == 0;
    }
  }
  else {
    ti_00 = (ti->_M_t).
            super___uniq_ptr_impl<chaiscript::Type_Info,_std::default_delete<chaiscript::Type_Info>_>
            ._M_t.
            super__Tuple_impl<0UL,_chaiscript::Type_Info_*,_std::default_delete<chaiscript::Type_Info>_>
            .super__Head_base<0UL,_chaiscript::Type_Info_*,_false>._M_head_impl;
    if (ti_00 != (Type_Info *)0x0) {
      bVar1 = Type_Info::bare_equal
                        (&((bv->m_data).
                           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr)->m_type_info,ti_00);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool dynamic_object_typename_match(const Boxed_Value &bv,
                                           const std::string &name,
                                           const std::unique_ptr<Type_Info> &ti,
                                           const Type_Conversions_State &t_conversions) const noexcept {
          if (bv.get_type_info().bare_equal(m_doti)) {
            try {
              const Dynamic_Object &d = boxed_cast<const Dynamic_Object &>(bv, &t_conversions);
              return name == "Dynamic_Object" || d.get_type_name() == name;
            } catch (const std::bad_cast &) {
              return false;
            }
          } else {
            if (ti) {
              return bv.get_type_info().bare_equal(*ti);
            } else {
              return false;
            }
          }
        }